

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::BlendA64MaskTest8B_ExtremeValues_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::BlendA64MaskTest8B_ExtremeValues_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x60068);
  anon_unknown.dwarf_105c52d::BlendA64MaskTest8B_ExtremeValues_Test::
  BlendA64MaskTest8B_ExtremeValues_Test((BlendA64MaskTest8B_ExtremeValues_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }